

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

lyxml_attr * lyxml_dup_attr(ly_ctx *ctx,lyxml_elem *parent,lyxml_attr *attr)

{
  LY_ERR *pLVar1;
  char *pcVar2;
  lyxml_attr *local_38;
  lyxml_attr *a;
  lyxml_attr *result;
  lyxml_attr *attr_local;
  lyxml_elem *parent_local;
  ly_ctx *ctx_local;
  
  if ((attr == (lyxml_attr *)0x0) || (parent == (lyxml_elem *)0x0)) {
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    if (attr->type == LYXML_ATTR_NS) {
      a = (lyxml_attr *)calloc(1,0x28);
    }
    else {
      a = (lyxml_attr *)calloc(1,0x28);
    }
    if (a == (lyxml_attr *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxml_dup_attr");
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      pcVar2 = lydict_insert(ctx,attr->value,0);
      a->value = pcVar2;
      pcVar2 = lydict_insert(ctx,attr->name,0);
      a->name = pcVar2;
      a->type = attr->type;
      if ((a->type == LYXML_ATTR_STD) && (attr->ns != (lyxml_ns *)0x0)) {
        a->ns = attr->ns;
        lyxml_correct_attr_ns(ctx,a,parent,1);
      }
      if (a->type == LYXML_ATTR_NS) {
        a->ns = (lyxml_ns *)parent;
      }
      if (parent->attr == (lyxml_attr *)0x0) {
        parent->attr = a;
      }
      else {
        for (local_38 = parent->attr; local_38->next != (lyxml_attr *)0x0; local_38 = local_38->next
            ) {
        }
        local_38->next = a;
      }
      ctx_local = (ly_ctx *)a;
    }
  }
  return (lyxml_attr *)ctx_local;
}

Assistant:

static struct lyxml_attr *
lyxml_dup_attr(struct ly_ctx *ctx, struct lyxml_elem *parent, struct lyxml_attr *attr)
{
    struct lyxml_attr *result, *a;

    if (!attr || !parent) {
        return NULL;
    }

    if (attr->type == LYXML_ATTR_NS) {
        /* this is correct, despite that all attributes seems like a standard
         * attributes (struct lyxml_attr), some of them can be namespace
         * definitions (and in that case they are struct lyxml_ns).
         */
        result = (struct lyxml_attr *)calloc(1, sizeof (struct lyxml_ns));
    } else {
        result = calloc(1, sizeof (struct lyxml_attr));
    }
    if (!result) {
        LOGMEM;
        return NULL;
    }
    result->value = lydict_insert(ctx, attr->value, 0);
    result->name = lydict_insert(ctx, attr->name, 0);
    result->type = attr->type;

    /* set namespace in case of standard attributes */
    if (result->type == LYXML_ATTR_STD && attr->ns) {
        result->ns = attr->ns;
        lyxml_correct_attr_ns(ctx, result, parent, 1);
    }

    /* set parent pointer in case of namespace attribute */
    if (result->type == LYXML_ATTR_NS) {
        ((struct lyxml_ns *)result)->parent = parent;
    }

    /* put attribute into the parent's attributes list */
    if (parent->attr) {
        /* go to the end of the list */
        for (a = parent->attr; a->next; a = a->next);
        /* and append new attribute */
        a->next = result;
    } else {
        /* add the first attribute in the list */
        parent->attr = result;
    }

    return result;
}